

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O1

void __thiscall arm::CtrlInst::CtrlInst(CtrlInst *this,string *key,any *val,bool is_asm_option)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_Inst).op = _Ctrl;
  (this->super_Inst).cond = Always;
  (this->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001f0aa0;
  (this->super_Inst).field_0xd = is_asm_option;
  paVar1 = &(this->key).field_2;
  (this->key)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (key->_M_dataplus)._M_p;
  paVar2 = &key->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&key->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->key).field_2 + 8) = uVar4;
  }
  else {
    (this->key)._M_dataplus._M_p = pcVar3;
    (this->key).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->key)._M_string_length = key->_M_string_length;
  (key->_M_dataplus)._M_p = (pointer)paVar2;
  key->_M_string_length = 0;
  (key->field_2)._M_local_buf[0] = '\0';
  std::any::any(&this->val,val);
  return;
}

Assistant:

Inst(OpCode op, ConditionCode cond = ConditionCode::Always)
      : op(op), cond(cond){}